

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Target * GPU_Init(Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  _Bool _Var1;
  GPU_Target *pGVar2;
  long lVar3;
  GPU_RendererID *pGVar4;
  int renderer_order_size;
  GPU_RendererID renderer_order [10];
  
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var1 = gpu_init_SDL();
  if (_Var1) {
    renderer_order_size = 0;
    GPU_GetRendererOrder(&renderer_order_size,renderer_order);
    lVar3 = -1;
    pGVar4 = renderer_order;
    do {
      lVar3 = lVar3 + 1;
      if (renderer_order_size <= lVar3) {
        GPU_PushErrorCode("GPU_Init",GPU_ERROR_BACKEND_ERROR,
                          "No renderer out of %d was able to initialize properly");
        return (GPU_Target *)0x0;
      }
      pGVar2 = GPU_InitRendererByID(*pGVar4,w,h,SDL_flags);
      pGVar4 = pGVar4 + 1;
    } while (pGVar2 == (GPU_Target *)0x0);
  }
  else {
    pGVar2 = (GPU_Target *)0x0;
  }
  return pGVar2;
}

Assistant:

GPU_Target* GPU_Init(Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    int renderer_order_size;
    int i;
    GPU_RendererID renderer_order[GPU_RENDERER_ORDER_MAX];

    gpu_init_error_queue();

    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer_order_size = 0;
    GPU_GetRendererOrder(&renderer_order_size, renderer_order);

    // Init the renderers in order
    for(i = 0; i < renderer_order_size; i++)
    {
        GPU_Target* screen = GPU_InitRendererByID(renderer_order[i], w, h, SDL_flags);
        if(screen != NULL)
            return screen;
    }

    GPU_PushErrorCode("GPU_Init", GPU_ERROR_BACKEND_ERROR, "No renderer out of %d was able to initialize properly", renderer_order_size);
    return NULL;
}